

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void __thiscall
TPZSkylMatrix<float>::DecomposeColumn
          (TPZSkylMatrix<float> *this,int64_t col,int64_t prevcol,
          list<long,_std::allocator<long>_> *singular)

{
  size_t *psVar1;
  float fVar2;
  float **ppfVar3;
  float *pfVar4;
  _List_node_base *p_Var5;
  long lVar6;
  long lVar7;
  float *pfVar8;
  float fVar9;
  
  ppfVar3 = (this->fElem).fStore;
  pfVar4 = ppfVar3[prevcol];
  lVar7 = (prevcol - ((long)ppfVar3[prevcol + 1] - (long)pfVar4 >> 2)) + 1;
  lVar6 = (col - ((long)ppfVar3[col + 1] - (long)ppfVar3[col] >> 2)) + 1;
  if (lVar6 < lVar7) {
    lVar6 = lVar7;
  }
  if (prevcol < lVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"error condition\n",0x10);
    std::ostream::flush();
    return;
  }
  pfVar8 = ppfVar3[col] + (col - lVar6);
  if (prevcol == lVar6) {
    fVar9 = 0.0;
  }
  else {
    lVar6 = prevcol * 4 + lVar6 * -4;
    fVar9 = 0.0;
    do {
      fVar2 = *pfVar8;
      pfVar8 = pfVar8 + -1;
      fVar9 = fVar9 + *(float *)((long)pfVar4 + lVar6) * fVar2;
      lVar6 = lVar6 + -4;
    } while (lVar6 != 0);
  }
  fVar9 = *pfVar8 - fVar9;
  *pfVar8 = fVar9;
  if (pfVar4 == pfVar8) {
    if (ABS(fVar9) < 1e-10) {
      p_Var5 = (_List_node_base *)operator_new(0x18);
      p_Var5[1]._M_next = (_List_node_base *)col;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(singular->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      fVar9 = 1.0;
    }
    if (fVar9 < 0.0) {
      fVar9 = sqrtf(fVar9);
    }
    else {
      fVar9 = SQRT(fVar9);
    }
  }
  else {
    fVar9 = fVar9 / *pfVar4;
  }
  *pfVar8 = fVar9;
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::DecomposeColumn(int64_t col, int64_t prevcol,std::list<int64_t> &singular){
    TVar *ptrprev;     //Pointer to prev column
    TVar *ptrcol;      //Pointer to col column
    int64_t skprev, skcol; //prev and col Skyline height respectively
    int64_t minline;
    
    skprev = SkyHeight(prevcol);
    skcol = SkyHeight(col);
    
    ptrprev = Diag(prevcol);
    ptrcol = Diag(col);
    
    if((prevcol-skprev) > (col-skcol)){
        minline = prevcol - skprev;
    }else
    {
        minline = col - skcol;
    }
    if(minline > prevcol) {
        cout << "error condition\n";
        cout.flush();
        return;
    }
    TVar *run1 = ptrprev + (prevcol-minline);
    TVar *run2 = ptrcol + (col-minline);
    TVar sum = 0;
    
    while(run1 != ptrprev) sum += (*run1--)*(*run2--);
    *run2-=sum;
    if(run1 != run2){
        *run2 /= *run1;
    }else{
        TVar pivot = *run2;
        if ( fabs(pivot) < fabs((TVar)1.e-10) ) {
#ifdef PZ_LOG
            std::stringstream sout;
            sout << "equation " << col << " is singular pivot " << pivot;
            LOGPZ_WARN(logger,sout.str())
#endif
            singular.push_back(col);
            pivot = 1.;
        }
        
        *run2=sqrt(pivot);
    }
    
}